

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O2

void __thiscall InitSocket::IpChangeThread(InitSocket *this)

{
  uint __i;
  int __fd;
  int iVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uint *puVar8;
  int iError;
  size_t local_1c8;
  uint local_1c0 [4];
  long local_1b0;
  socklen_t iLen;
  undefined4 uStack_1a4;
  pointer ptStack_1a0;
  pointer local_198;
  timeval timeout;
  _Bind<int_(InitSocket::*(InitSocket_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>))(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_void_*)>
  local_178;
  sockaddr local_160;
  function<int_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_void_*)>
  local_150;
  fd_set errorfd;
  fd_set readfd;
  
  __fd = socket(0x10,3,0);
  if (__fd != -1) {
    local_160.sa_family = 0x10;
    local_160.sa_data[0] = '\0';
    local_160.sa_data[1] = '\0';
    local_160.sa_data[2] = '\0';
    local_160.sa_data[3] = '\0';
    local_160.sa_data[4] = '\0';
    local_160.sa_data[5] = '\0';
    local_160.sa_data[6] = '\x11';
    local_160.sa_data[7] = '\x01';
    local_160.sa_data[8] = '\0';
    local_160.sa_data[9] = '\0';
    iVar1 = bind(__fd,&local_160,0xc);
    if ((iVar1 != -1) && (iVar1 = fcntl(__fd,2,1), iVar1 != -1)) {
      uVar2 = fcntl(__fd,3);
      iVar1 = fcntl(__fd,4,(ulong)(uVar2 | 0x800));
      if ((iVar1 != -1) && (this->m_bStopThread == false)) {
        lVar7 = (long)(__fd / 0x40);
        uVar6 = 1L << ((byte)__fd & 0x3f);
        local_1b0 = lVar7;
        do {
          timeout.tv_sec = 2;
          timeout.tv_usec = 0;
          for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
            readfd.fds_bits[lVar4] = 0;
          }
          for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
            errorfd.fds_bits[lVar4] = 0;
          }
          readfd.fds_bits[lVar7] = readfd.fds_bits[lVar7] | uVar6;
          errorfd.fds_bits[lVar7] = errorfd.fds_bits[lVar7] | uVar6;
          iVar1 = select(__fd + 1,(fd_set *)&readfd,(fd_set *)0x0,(fd_set *)&errorfd,
                         (timeval *)&timeout);
          if (0 < iVar1) {
            if ((errorfd.fds_bits[lVar7] & uVar6) != 0) {
              _iLen = (pointer)CONCAT44(uStack_1a4,4);
              getsockopt(__fd,1,4,&iError,&iLen);
              break;
            }
            if ((readfd.fds_bits[lVar7] & uVar6) != 0) {
              _iError = local_1c0;
              std::__cxx11::string::_M_construct((ulong)&iError,'\0');
              uVar5 = recv(__fd,_iError,local_1c8,0);
              puVar8 = _iError;
              if (0 < (int)uVar5) {
                for (; ((uVar2 = (uint)uVar5, 0xf < uVar2 && (uVar3 = *puVar8, 0xf < uVar3)) &&
                       (uVar3 <= uVar2)); puVar8 = (uint *)((long)puVar8 + (ulong)uVar3)) {
                  if ((ushort)puVar8[1] - 0x14 < 3) {
                    _iLen = (pointer)0x0;
                    ptStack_1a0 = (pointer)0x0;
                    local_198 = (pointer)0x0;
                    local_178._M_f = (offset_in_InitSocket_to_subr)CbEnumIpAdressen;
                    local_178._8_8_ = 0;
                    local_178._M_bound_args.
                    super__Tuple_impl<0UL,_InitSocket_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
                    .super__Head_base<0UL,_InitSocket_*,_false>._M_head_impl =
                         (_Tuple_impl<0UL,_InitSocket_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
                          )(_Tuple_impl<0UL,_InitSocket_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>_>
                            )this;
                    std::function<int(int,std::__cxx11::string_const&,int,void*)>::
                    function<std::_Bind<int(InitSocket::*(InitSocket*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>,std::_Placeholder<4>))(int,std::__cxx11::string_const&,int,void*)>,void>
                              ((function<int(int,std::__cxx11::string_const&,int,void*)> *)
                               &local_150,&local_178);
                    BaseSocketImpl::EnumIpAddresses
                              (&local_150,
                               (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                                *)&iLen);
                    std::_Function_base::~_Function_base(&local_150.super__Function_base);
                    NotifyOnAddressChanges
                              (this,(vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                                     *)&iLen);
                    std::
                    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                    ::~vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                               *)&iLen);
                    uVar3 = *puVar8;
                  }
                  else if ((ushort)puVar8[1] == 3) break;
                  uVar3 = uVar3 + 3 & 0xfffffffc;
                  uVar5 = (ulong)(uVar2 - uVar3);
                }
              }
              std::__cxx11::string::~string((string *)&iError);
              lVar7 = local_1b0;
            }
          }
        } while (this->m_bStopThread == false);
      }
    }
    close(__fd);
  }
  return;
}

Assistant:

void InitSocket::IpChangeThread()
{
    SOCKET fSock;
    if ((fSock = socket(PF_NETLINK, SOCK_RAW, NETLINK_ROUTE)) == -1)
    {
        return;
    }

    struct sockaddr_nl addr{};
    addr.nl_family = AF_NETLINK;
    addr.nl_groups = RTMGRP_LINK | RTMGRP_IPV4_IFADDR | RTMGRP_IPV6_IFADDR;

    if (bind(fSock, reinterpret_cast<struct sockaddr *>(&addr), sizeof(addr)) == -1)
    {
        ::closesocket(fSock);
        return;
    }

    if (fcntl(fSock, F_SETFD, FD_CLOEXEC) == -1 || fcntl(fSock, F_SETFL, fcntl(fSock, F_GETFL) | O_NONBLOCK) == -1)
    {
        ::closesocket(fSock);
        return;
    }

    while (m_bStopThread == false)
    {
        fd_set readfd, errorfd;
        struct timeval timeout;

        timeout.tv_sec = 2;
        timeout.tv_usec = 0;
        FD_ZERO(&readfd);
        FD_ZERO(&errorfd);

        FD_SET(fSock, &readfd);
        FD_SET(fSock, &errorfd);

        if (::select(static_cast<int>(fSock + 1), &readfd, nullptr, &errorfd, &timeout) > 0)
        {
            if (FD_ISSET(fSock, &errorfd))
            {
                int iError;
                socklen_t iLen = sizeof(iError);
                getsockopt(fSock, SOL_SOCKET, SO_ERROR, reinterpret_cast<char*>(&iError), &iLen);
                break;
            }

            if (FD_ISSET(fSock, &readfd))
            {
                string buf(4096, 0);
                int32_t transferred = ::recv(fSock, &buf[0], buf.size(), 0);

                if (transferred > 0)
                {
                    struct nlmsghdr* nlh = reinterpret_cast<struct nlmsghdr*>(&buf[0]);
                    while ((NLMSG_OK(nlh, static_cast<unsigned int>(transferred))) && (nlh->nlmsg_type != NLMSG_DONE))
                    {
                        if (nlh->nlmsg_type == RTM_NEWADDR || nlh->nlmsg_type == RTM_DELADDR || nlh->nlmsg_type == RTM_GETADDR)
                        {
                            /*struct ifaddrmsg *ifa = (struct ifaddrmsg *) NLMSG_DATA(nlh);
                            struct rtattr *rth = IFA_RTA(ifa);
                            int rtl = IFA_PAYLOAD(nlh);

                            char name[IFNAMSIZ];
                            if_indextoname(ifa->ifa_index, name);
                            */
                            vector<tuple<string, int, int>> vNewIPAddr;
                            BaseSocketImpl::EnumIpAddresses(bind(&InitSocket::CbEnumIpAdressen, this, placeholders::_1, placeholders::_2, placeholders::_3, placeholders::_4), &vNewIPAddr);
                            NotifyOnAddressChanges(vNewIPAddr);
                        }
                        nlh = NLMSG_NEXT(nlh, transferred);
                    }
                }
            }
        }
    }

    ::closesocket(fSock);
}